

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.hpp
# Opt level: O2

void __thiscall
primecount::Vector<primecount::PiTable::pi_t,_std::allocator<primecount::PiTable::pi_t>_>::
reserve_unchecked(Vector<primecount::PiTable::pi_t,_std::allocator<primecount::PiTable::pi_t>_>
                  *this,size_t n)

{
  pi_t *__src;
  pi_t *ppVar1;
  ulong uVar2;
  pi_t *__dest;
  ulong uVar3;
  size_t __n;
  new_allocator<primecount::PiTable::pi_t> local_31;
  
  __src = this->array_;
  ppVar1 = this->end_;
  __n = (long)ppVar1 - (long)__src;
  uVar3 = (long)this->capacity_ - (long)__src;
  uVar2 = (long)uVar3 >> 4;
  uVar2 = (uVar2 >> 1) + uVar2;
  if (uVar2 <= n) {
    uVar2 = n;
  }
  __dest = __gnu_cxx::new_allocator<primecount::PiTable::pi_t>::allocate
                     (&local_31,uVar2,(void *)0x0);
  this->array_ = __dest;
  this->end_ = (pi_t *)((long)__dest + __n);
  this->capacity_ = __dest + uVar2;
  if (__src != (pi_t *)0x0) {
    if (ppVar1 != __src) {
      memmove(__dest,__src,__n);
    }
    operator_delete(__src,uVar3);
  }
  return;
}

Assistant:

void reserve_unchecked(std::size_t n)
  {
    ASSERT(n > capacity());
    ASSERT(size() <= capacity());
    std::size_t old_size = size();
    std::size_t old_capacity = capacity();

    // GCC & Clang's std::vector grow the capacity by at least
    // 2x for every call to resize() with n > capacity(). We
    // grow by at least 1.5x as we tend to accurately calculate
    // the amount of memory we need upfront.
    std::size_t new_capacity = (old_capacity * 3) / 2;
    new_capacity = std::max(new_capacity, n);
    ASSERT(old_capacity < new_capacity);

    T* old = array_;
    array_ = Allocator().allocate(new_capacity);
    end_ = array_ + old_size;
    capacity_ = array_ + new_capacity;
    ASSERT(size() < capacity());

    // Both primesieve & primecount require that byte arrays are
    // aligned to at least a alignof(uint64_t) boundary. This is
    // needed because our code casts byte arrays into uint64_t arrays
    // in some places in order to improve performance. The default
    // allocator guarantees that each memory allocation is at least
    // aligned to the largest built-in type (usually 16 or 32).
    ASSERT(((uintptr_t) (void*) array_) % sizeof(uint64_t) == 0);

    if (old)
    {
      static_assert(std::is_nothrow_move_constructible<T>::value,
                    "Vector<T> only supports nothrow moveable types!");

      uninitialized_move_n(old, old_size, array_);
      Allocator().deallocate(old, old_capacity);
    }
  }